

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::EmitScopeObjectInit(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint count;
  int iVar1;
  ParseableFunctionInfo *this_00;
  ParseNode *pPVar2;
  code *pcVar3;
  PropertyIdArray *pPVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  FunctionBody *pFVar8;
  Symbol *pSVar9;
  ParseNodeVar *pPVar10;
  ParseNodePtr pPVar11;
  ParseNodeFnc *pPVar12;
  ParseNode *pnode;
  ParseNodeFnc *pPVar13;
  int iVar14;
  ulong uVar15;
  Symbol *sym;
  anon_class_32_4_e369621f local_90;
  anon_class_8_1_3fcf6586 local_70;
  ulong local_68;
  Scope *local_60;
  FuncInfo *local_58;
  ParseNodeFnc *local_50;
  uint local_44;
  PropertyId local_40;
  uint cachedFuncCount;
  PropertyId firstFuncSlot;
  PropertyId firstVarSlot;
  PropertyIdArray *propIds;
  
  this_00 = funcInfo->byteCodeFunction;
  bVar5 = Js::FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar5) goto LAB_0080e724;
    *puVar7 = 0;
  }
  if ((this_00->flags & Flags_StackNestedFunc) != Flags_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x627,
                       "(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc())",
                       "!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc()");
    if (!bVar5) goto LAB_0080e724;
    *puVar7 = 0;
  }
  if ((funcInfo->field_0xb5 & 1) == 0) {
    return;
  }
  local_60 = funcInfo->currentChildScope;
  count = local_60->scopeSlotCount;
  uVar15 = (ulong)count;
  local_40 = -1;
  cachedFuncCount = 0xffffffff;
  local_44 = 0;
  if ((0x3ffffffe < count >> 2) || (0x3fffffff < count + 4)) {
    Math::DefaultOverflowPolicy();
  }
  pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
  _firstFuncSlot =
       Js::FunctionBody::AllocatePropertyIdArrayForFormals(pFVar8,(count + 4) * 4,count,'\x04');
  pPVar13 = funcInfo->root;
  if (((funcInfo->field_0xb5 & 2) != 0) &&
     (pSVar9 = ParseNodeFnc::GetFuncSymbol(pPVar13), pSVar9->scope == funcInfo->bodyScope)) {
    pSVar9 = ParseNodeFnc::GetFuncSymbol(pPVar13);
    Symbol::SaveToPropIdArray(pSVar9,_firstFuncSlot,this,(PropertyId *)0x0);
  }
  pPVar11 = pPVar13->pnodeParams;
  local_58 = funcInfo;
  local_68 = uVar15;
  if ((funcInfo->field_0xb4 & 8) == 0) {
    while (local_50 = pPVar13, pPVar11 != (ParseNode *)0x0) {
      if ((byte)(pPVar11->nop + ~knopList) < 3) {
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        Symbol::SaveToPropIdArray(pPVar10->sym,_firstFuncSlot,this,(PropertyId *)0x0);
      }
      pPVar11 = ParseNode::GetFormalNext(pPVar11);
      pPVar13 = local_50;
    }
    pPVar2 = pPVar13->pnodeRest;
    if ((pPVar2 != (ParseNode *)0x0) && ((byte)(pPVar2->nop + ~knopList) < 3)) {
      pPVar10 = ParseNode::AsParseNodeVar(pPVar2);
      pSVar9 = pPVar10->sym;
LAB_0080e4d8:
      Symbol::SaveToPropIdArray(pSVar9,_firstFuncSlot,this,(PropertyId *)0x0);
    }
  }
  else {
    local_50 = pPVar13;
    if (pPVar11 != (ParseNodePtr)0x0) {
      iVar14 = 0;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_0080e3a1:
      if ((byte)(pPVar11->nop + ~knopList) < 3) {
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        pSVar9 = pPVar10->sym;
        if (pSVar9 == (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x64d,"(sym)","sym");
          if (!bVar5) goto LAB_0080e724;
          *puVar7 = 0;
        }
        iVar1 = pSVar9->scopeSlot;
        if (iVar14 == iVar1) {
          Symbol::SaveToPropIdArray(pSVar9,_firstFuncSlot,this,(PropertyId *)0x0);
          goto LAB_0080e484;
        }
        if (iVar1 != -1 && iVar14 < iVar1) goto LAB_0080e475;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x657,
                           "(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot)"
                           ,
                           "sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot"
                          );
        if (!bVar5) goto LAB_0080e724;
        *puVar7 = 0;
      }
LAB_0080e475:
      (&_firstFuncSlot[1].count)[iVar14] = 0xffffffff;
LAB_0080e484:
      iVar14 = iVar14 + 1;
      pPVar11 = ParseNode::GetFormalNext(pPVar11);
      if (pPVar11 == (ParseNodePtr)0x0) goto LAB_0080e49b;
      goto LAB_0080e3a1;
    }
LAB_0080e49b:
    pPVar13 = local_50;
    funcInfo = local_58;
    pPVar2 = local_50->pnodeRest;
    if ((pPVar2 != (ParseNode *)0x0) && ((byte)(pPVar2->nop + ~knopList) < 3)) {
      pPVar10 = ParseNode::AsParseNodeVar(pPVar2);
      pSVar9 = pPVar10->sym;
      bVar5 = Symbol::IsInSlot(pSVar9,this,funcInfo,false);
      if (bVar5) goto LAB_0080e4d8;
    }
  }
  local_90.propIds = (PropertyIdArray **)&firstFuncSlot;
  local_90.firstFuncSlot = &local_40;
  local_90.cachedFuncCount = &local_44;
  local_90.this = this;
  pPVar12 = ParseNode::AsParseNodeFnc(&pPVar13->super_ParseNode);
  local_70.fn = &local_90;
  MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1658:42)>
  ::anon_class_8_1_3fcf6586::operator()(&local_70,pPVar12->pnodeScopes->pnodeScopes);
  if (pPVar12->pnodeBodyScope != (ParseNodeBlock *)0x0) {
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1658:42)>
    ::anon_class_8_1_3fcf6586::operator()(&local_70,pPVar12->pnodeBodyScope->pnodeScopes);
  }
  if (local_60->scopeType == ScopeType_Parameter) {
    if ((funcInfo->field_0xb5 & 0x80) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x6bc,"(!funcInfo->IsBodyAndParamScopeMerged())",
                         "!funcInfo->IsBodyAndParamScopeMerged()");
      if (!bVar5) {
LAB_0080e724:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
  }
  else {
    pPVar11 = pPVar13->pnodeVars;
    if (pPVar11 != (ParseNodePtr)0x0) {
      do {
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        pSVar9 = pPVar10->sym;
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        if ((pPVar10->isBlockScopeFncDeclVar == '\0') || ((pSVar9->field_0x42 & 2) == 0)) {
          if (((*(ushort *)&pSVar9->field_0x42 & 0x40) != 0) ||
             ((sym = pSVar9, (*(ushort *)&pSVar9->field_0x42 & 2) != 0 &&
              (pPVar11->nop == knopVarDecl)))) {
            sym = local_60->m_symList;
            while ((sym != (Symbol *)0x0 &&
                   (bVar5 = JsUtil::CharacterBuffer<char16_t>::operator==(&sym->name,&pSVar9->name),
                   !bVar5))) {
              sym = sym->next;
            }
          }
          Symbol::SaveToPropIdArray(sym,_firstFuncSlot,this,(PropertyId *)&cachedFuncCount);
        }
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        pPVar11 = pPVar10->pnodeNext;
      } while (pPVar11 != (ParseNodePtr)0x0);
    }
    pPVar13 = local_50;
    pPVar11 = local_50->pnodeScopes->pnodeLexVars;
    if (pPVar11 != (ParseNodePtr)0x0) {
      do {
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        Symbol::SaveToPropIdArray(pPVar10->sym,_firstFuncSlot,this,(PropertyId *)&cachedFuncCount);
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        pPVar11 = pPVar10->pnodeNext;
      } while (pPVar11 != (ParseNodePtr)0x0);
    }
    funcInfo = local_58;
    pPVar11 = pPVar13->pnodeBodyScope->pnodeLexVars;
    if (pPVar11 != (ParseNodePtr)0x0) {
      do {
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        Symbol::SaveToPropIdArray(pPVar10->sym,_firstFuncSlot,this,(PropertyId *)&cachedFuncCount);
        pPVar10 = ParseNode::AsParseNodeVar(pPVar11);
        pPVar11 = pPVar10->pnodeNext;
      } while (pPVar11 != (ParseNodePtr)0x0);
    }
  }
  pPVar4 = _firstFuncSlot;
  uVar15 = local_68;
  (&_firstFuncSlot[1].count)[local_68] = local_44;
  *(PropertyId *)(&_firstFuncSlot[1].extraSlots + local_68 * 4) = local_40;
  (&_firstFuncSlot[2].count)[local_68] = cachedFuncCount;
  pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
  uVar6 = Js::FunctionBody::NewObjectLiteral(pFVar8);
  *(uint *)(&pPVar4[2].extraSlots + uVar15 * 4) = uVar6;
  _firstFuncSlot->hasNonSimpleParams = (Type)((byte)(funcInfo->root->fncFlags >> 0xf) & 1);
  pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
  pFVar8->hasCachedScopePropIds = true;
  return;
}

Assistant:

void ByteCodeGenerator::EmitScopeObjectInit(FuncInfo *funcInfo)
{
    Assert(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc());

    if (!funcInfo->GetHasCachedScope() /* || forcing scope/inner func caching */)
    {
        return;
    }

    Scope* currentScope = funcInfo->GetCurrentChildScope();
    uint slotCount = currentScope->GetScopeSlotCount();
    uint cachedFuncCount = 0;
    Js::PropertyId firstFuncSlot = Js::Constants::NoProperty;
    Js::PropertyId firstVarSlot = Js::Constants::NoProperty;

    uint extraAlloc = UInt32Math::Add(slotCount, Js::ActivationObjectEx::ExtraSlotCount());
    extraAlloc = UInt32Math::Mul(extraAlloc, sizeof(Js::PropertyId));

    // Create and fill the array of local property ID's.
    // They all have slots assigned to them already (if they need them): see StartEmitFunction.

    Js::PropertyIdArray *propIds = funcInfo->GetParsedFunctionBody()->AllocatePropertyIdArrayForFormals(extraAlloc, slotCount, Js::ActivationObjectEx::ExtraSlotCount());

    ParseNodeFnc *pnodeFnc = funcInfo->root;

    if (funcInfo->GetFuncExprNameReference() && pnodeFnc->GetFuncSymbol()->GetScope() == funcInfo->GetBodyScope())
    {
        Symbol::SaveToPropIdArray(pnodeFnc->GetFuncSymbol(), propIds, this);
    }

    if (funcInfo->GetHasArguments())
    {
        // Because the arguments object can access all instances of same-named formals ("function(x,x){...}"),
        // be sure we initialize any duplicate appearances of a formal parameter to "NoProperty".
        Js::PropertyId slot = 0;
        auto initArg = [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol *sym = pnode->AsParseNodeVar()->sym;
                Assert(sym);
                if (sym->GetScopeSlot() == slot)
                {
                    // This is the last appearance of the formal, so record the ID.
                    Symbol::SaveToPropIdArray(sym, propIds, this);
                }
                else
                {
                    // This is an earlier duplicate appearance of the formal, so use NoProperty as a placeholder
                    // since this slot can't be accessed by name.
                    Assert(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot);
                    propIds->elements[slot] = Js::Constants::NoProperty;
                }
            }
            else
            {
                // This is for patterns
                propIds->elements[slot] = Js::Constants::NoProperty;
            }
            slot++;
        };
        MapFormalsWithoutRest(pnodeFnc, initArg);

        ParseNodePtr rest = pnodeFnc->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // If the rest is in the slot - we need to keep that slot.
            Symbol *sym = rest->AsParseNodeVar()->sym;
            if (sym->IsInSlot(this, funcInfo))
            {
                Symbol::SaveToPropIdArray(sym, propIds, this);
            }
        }
    }
    else
    {
        MapFormals(pnodeFnc, [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol::SaveToPropIdArray(pnode->AsParseNodeVar()->sym, propIds, this);
            }
        });
    }

    auto saveFunctionVarsToPropIdArray = [&](ParseNode *pnodeFunction)
    {
        if (pnodeFunction->AsParseNodeFnc()->IsDeclaration())
        {
            ParseNode *pnodeName = pnodeFunction->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                while (pnodeName->nop == knopList)
                {
                    if (pnodeName->AsParseNodeBin()->pnode1->nop == knopVarDecl)
                    {
                        Symbol *sym = pnodeName->AsParseNodeBin()->pnode1->AsParseNodeVar()->sym;
                        if (sym)
                        {
                            Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        }
                    }
                    pnodeName = pnodeName->AsParseNodeBin()->pnode2;
                }
                if (pnodeName->nop == knopVarDecl)
                {
                    Symbol *sym = pnodeName->AsParseNodeVar()->sym;
                    if (sym)
                    {
                        Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        cachedFuncCount++;
                    }
                }
            }
        }
    };
    MapContainerScopeFunctions(pnodeFnc, saveFunctionVarsToPropIdArray);

    if (currentScope->GetScopeType() != ScopeType_Parameter)
    {
        ParseNode *pnode;
        Symbol *sym;
        for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
            {
                if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                {
                    sym = currentScope->FindLocalSymbol(sym->GetName());
                }
                Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
            }
        }

        ParseNodeBlock *pnodeBlock = pnodeFnc->pnodeScopes;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }

        pnodeBlock = pnodeFnc->pnodeBodyScope;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }
    }
    else
    {
        Assert(!funcInfo->IsBodyAndParamScopeMerged());
    }

    // Write the first func slot and first var slot into the auxiliary data
    Js::PropertyId *slots = propIds->elements + slotCount;
    slots[0] = cachedFuncCount;
    slots[1] = firstFuncSlot;
    slots[2] = firstVarSlot;
    slots[3] = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

    propIds->hasNonSimpleParams = funcInfo->root->HasNonSimpleParameterList();

    funcInfo->GetParsedFunctionBody()->SetHasCachedScopePropIds(true);
}